

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

bool __thiscall
Jinx::Impl::Parser::CheckProperty(Parser *this,SymbolListCItr currSym,size_t *symCount)

{
  undefined8 uVar1;
  undefined8 this_00;
  size_t *psVar2;
  bool bVar3;
  bool bVar4;
  pointer pbVar5;
  SymbolListCItr currSym_00;
  LibraryIPtr library;
  String libraryName;
  undefined1 local_a0 [24];
  element_type *local_88;
  LibraryIPtr local_80;
  LibraryIPtr local_70;
  size_t *local_60;
  pointer local_58;
  String local_50;
  
  if (((this->m_error != false) ||
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish == currSym._M_current)) ||
     ((currSym._M_current)->type != NameValue)) {
    return false;
  }
  CheckLibraryName_abi_cxx11_(&local_50,this);
  if (local_50._M_string_length == 0) {
    local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    if (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __assert_fail("m_library",
                    "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                    ,0x34c,"bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const")
      ;
    }
    local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar3 = CheckPropertyName(this,&local_80,currSym,symCount);
    if (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = true;
    if (bVar3) goto LAB_001fd5e2;
    pbVar5 = (this->m_importList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (this->m_importList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    psVar2 = symCount;
    if (pbVar5 != local_58) {
      do {
        local_60 = psVar2;
        Runtime::GetLibrary((Runtime *)local_a0,
                            (String *)
                            (this->m_runtime).
                            super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        this_00 = local_a0._8_8_;
        uVar1 = local_a0._0_8_;
        if ((element_type *)local_a0._8_8_ == (element_type *)0x0) {
          if ((element_type *)local_a0._0_8_ !=
              (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr) {
            local_88 = (element_type *)0x0;
            goto LAB_001fd59a;
          }
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
            if ((element_type *)local_a0._8_8_ != (element_type *)0x0) goto LAB_001fd561;
          }
          else {
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
LAB_001fd561:
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
          }
          if ((element_type *)uVar1 ==
              (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          else {
            local_88 = (element_type *)this_00;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                            _M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                            _M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
            }
LAB_001fd59a:
            bVar3 = CheckPropertyName(this,(LibraryIPtr *)(local_a0 + 0x10),currSym,local_60);
            if (local_88 != (element_type *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88);
            }
            if ((element_type *)this_00 != (element_type *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
            }
            if (bVar3) goto LAB_001fd5e2;
          }
        }
        pbVar5 = pbVar5 + 1;
        psVar2 = local_60;
      } while (pbVar5 != local_58);
    }
  }
  else {
    currSym_00._M_current = currSym._M_current + 1;
    if ((currSym_00._M_current !=
         (this->m_symbolList->
         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
         super__Vector_impl_data._M_finish) && ((currSym_00._M_current)->type == NameValue)) {
      Runtime::GetLibraryInternal
                ((Runtime *)local_a0,
                 (String *)
                 (this->m_runtime).
                 super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if ((element_type *)local_a0._0_8_ == (element_type *)0x0) {
        __assert_fail("library",
                      "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                      ,0x347,
                      "bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const");
      }
      local_70.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_a0._0_8_;
      local_70.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_;
      if ((element_type *)local_a0._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                   _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                        _M_weak_this).
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                   _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_a0._8_8_ + 8))->
                        _M_weak_this).
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
      }
      bVar4 = CheckPropertyName(this,&local_70,currSym_00,symCount);
      if ((element_type *)
          local_70.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((element_type *)local_a0._8_8_ != (element_type *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
      }
      goto LAB_001fd5e2;
    }
  }
  bVar4 = false;
LAB_001fd5e2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

inline_t bool Parser::CheckProperty(SymbolListCItr currSym, size_t * symCount) const
	{
		// Check symbol validity
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check to see if this begins with a library name
		String libraryName = CheckLibraryName();
		if (!libraryName.empty())
		{
			// Get next symbol and check validity
			auto currentSymbol = currSym;
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return false;
			if (currentSymbol->type != SymbolType::NameValue)
				return false;

			// Check for property name in this specific library
			auto library = m_runtime->GetLibraryInternal(libraryName);
			assert(library);
			return CheckPropertyName(library, currentSymbol, symCount);
		}

		// Check for property name in the current library
		assert(m_library);
		if (CheckPropertyName(m_library, currSym, symCount))
			return true;

		// Check against all imported libraries
		for (auto & importName : m_importList)
		{
			auto library = m_runtime->GetLibraryInternal(importName);
			if (library != m_library && CheckPropertyName(library, currSym, symCount))
				return true;
		}
		return false;
	}